

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_compress_insertDictionary
                 (ZSTD_compressedBlockState_t *bs,ZSTD_matchState_t *ms,ldmState_t *ls,
                 ZSTD_cwksp *ws,ZSTD_CCtx_params *params,void *dict,size_t dictSize,
                 ZSTD_dictContentType_e dictContentType,ZSTD_dictTableLoadMethod_e dtlm,
                 ZSTD_tableFillPurpose_e tfp,void *workspace)

{
  size_t err_code;
  size_t sVar1;
  BYTE *dictPtr;
  size_t sVar2;
  
  if (dict == (void *)0x0 || dictSize < 8) {
    return (ulong)(dictContentType != ZSTD_dct_fullDict) * 0x20 - 0x20;
  }
  ZSTD_reset_compressedBlockState(bs);
  if (dictContentType == ZSTD_dct_rawContent) {
LAB_01bb58fc:
    ZSTD_loadDictionaryContent(ms,ls,ws,params,dict,dictSize,dtlm,tfp);
    sVar1 = 0;
  }
  else {
    if (*dict != -0x13cf5bc9) {
      if (dictContentType == ZSTD_dct_fullDict) {
        return 0xffffffffffffffe0;
      }
      if (dictContentType == ZSTD_dct_auto) goto LAB_01bb58fc;
    }
    if ((params->fParams).noDictIDFlag == 0) {
      sVar2 = (size_t)*(uint *)((long)dict + 4);
    }
    else {
      sVar2 = 0;
    }
    sVar1 = ZSTD_loadCEntropy(bs,workspace,dict,dictSize);
    if (sVar1 < 0xffffffffffffff89) {
      ZSTD_loadDictionaryContent
                (ms,(ldmState_t *)0x0,ws,params,(void *)((long)dict + sVar1),dictSize - sVar1,dtlm,
                 tfp);
      sVar1 = sVar2;
    }
  }
  return sVar1;
}

Assistant:

static size_t
ZSTD_compress_insertDictionary(ZSTD_compressedBlockState_t* bs,
                               ZSTD_matchState_t* ms,
                               ldmState_t* ls,
                               ZSTD_cwksp* ws,
                         const ZSTD_CCtx_params* params,
                         const void* dict, size_t dictSize,
                               ZSTD_dictContentType_e dictContentType,
                               ZSTD_dictTableLoadMethod_e dtlm,
                               ZSTD_tableFillPurpose_e tfp,
                               void* workspace)
{
    DEBUGLOG(4, "ZSTD_compress_insertDictionary (dictSize=%u)", (U32)dictSize);
    if ((dict==NULL) || (dictSize<8)) {
        RETURN_ERROR_IF(dictContentType == ZSTD_dct_fullDict, dictionary_wrong, "");
        return 0;
    }

    ZSTD_reset_compressedBlockState(bs);

    /* dict restricted modes */
    if (dictContentType == ZSTD_dct_rawContent)
        return ZSTD_loadDictionaryContent(ms, ls, ws, params, dict, dictSize, dtlm, tfp);

    if (MEM_readLE32(dict) != ZSTD_MAGIC_DICTIONARY) {
        if (dictContentType == ZSTD_dct_auto) {
            DEBUGLOG(4, "raw content dictionary detected");
            return ZSTD_loadDictionaryContent(
                ms, ls, ws, params, dict, dictSize, dtlm, tfp);
        }
        RETURN_ERROR_IF(dictContentType == ZSTD_dct_fullDict, dictionary_wrong, "");
        assert(0);   /* impossible */
    }

    /* dict as full zstd dictionary */
    return ZSTD_loadZstdDictionary(
        bs, ms, ws, params, dict, dictSize, dtlm, tfp, workspace);
}